

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

_Bool textui_get_item(object **choice,char *pmt,char *str,cmd_code cmd,item_tester tester,
                     wchar_t mode)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Bool _Var6;
  bool bVar7;
  int iVar8;
  wchar_t wVar9;
  object *poVar10;
  size_t sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  wchar_t local_98;
  wchar_t local_90;
  ulong local_88;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  byte local_79;
  byte local_69;
  byte local_5b;
  byte local_5a;
  byte local_59;
  int local_58;
  int local_54;
  wchar_t ne;
  wchar_t ni;
  wchar_t j;
  wchar_t throwing_max;
  wchar_t floor_num;
  wchar_t floor_max;
  _Bool toggle;
  _Bool allow_floor;
  _Bool allow_quiver;
  _Bool allow_equip;
  _Bool allow_inven;
  _Bool show_throwing;
  _Bool quiver_tags;
  _Bool use_floor;
  _Bool use_quiver;
  _Bool use_equip;
  _Bool use_inven;
  wchar_t mode_local;
  item_tester tester_local;
  cmd_code cmd_local;
  char *str_local;
  char *pmt_local;
  object **choice_local;
  
  bVar12 = (mode & 2U) == 0;
  bVar13 = (mode & 1U) == 0;
  bVar14 = (mode & 8U) == 0;
  bVar15 = (mode & 4U) == 0;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  bVar7 = false;
  uVar1 = z_info->floor_size;
  iVar8 = (uint)z_info->pack_size + (uint)z_info->quiver_size + (uint)z_info->floor_size;
  floor_list = (object **)mem_zalloc((long)(int)(uint)uVar1 << 3);
  throwing_list = (object **)mem_zalloc((long)iVar8 << 3);
  allow_all = str == (char *)0x0;
  if ((mode & 0x40U) == 0) {
    olist_mode = OLIST_WEIGHT;
  }
  else {
    olist_mode = OLIST_FAIL;
  }
  if ((mode & 0x20U) != 0) {
    olist_mode = olist_mode | OLIST_PRICE;
  }
  if ((mode & 0x100U) != 0) {
    olist_mode = olist_mode | OLIST_SEMPTY;
  }
  if ((mode & 0x80U) != 0) {
    olist_mode = olist_mode | OLIST_QUIVER;
  }
  if ((mode & 0x400U) != 0) {
    olist_mode = olist_mode | OLIST_RECHARGE;
  }
  item_mode = mode;
  item_cmd = cmd;
  tester_m = tester;
  prompt = pmt;
  event_signal(EVENT_MESSAGE_FLUSH);
  i1 = L'\0';
  i2 = (uint)z_info->pack_size + L'\xffffffff';
  if (bVar12) {
    i2 = L'\xffffffff';
  }
  while( true ) {
    local_59 = 0;
    if (i1 <= i2) {
      _Var6 = object_test(tester,player->upkeep->inven[i1]);
      local_59 = _Var6 ^ 0xff;
    }
    if ((local_59 & 1) == 0) break;
    i1 = i1 + L'\x01';
  }
  while( true ) {
    local_5a = 0;
    if (i1 <= i2) {
      _Var6 = object_test(tester,player->upkeep->inven[i2]);
      local_5a = _Var6 ^ 0xff;
    }
    if ((local_5a & 1) == 0) break;
    i2 = i2 + L'\xffffffff';
  }
  if ((i2 < i1) && ((allow_all & 1U) == 0)) {
    if ((item_mode & 2U) != 0) {
      item_mode = item_mode + L'\xfffffffe';
    }
  }
  else {
    bVar2 = true;
  }
  e1 = L'\0';
  e2 = (uint)(player->body).count + L'\xffffffff';
  if (bVar13) {
    e2 = L'\xffffffff';
  }
  if ((cmd != CMD_NULL) || (tester != (item_tester)0x0)) {
    while( true ) {
      local_5b = 0;
      if (e1 <= e2) {
        poVar10 = slot_object(player,e1);
        _Var6 = object_test(tester,poVar10);
        local_5b = _Var6 ^ 0xff;
      }
      if ((local_5b & 1) == 0) break;
      e1 = e1 + L'\x01';
    }
    while( true ) {
      local_69 = 0;
      if (e1 <= e2) {
        poVar10 = slot_object(player,e2);
        _Var6 = object_test(tester,poVar10);
        local_69 = _Var6 ^ 0xff;
      }
      if ((local_69 & 1) == 0) break;
      e2 = e2 + L'\xffffffff';
    }
  }
  if ((e2 < e1) && ((allow_all & 1U) == 0)) {
    if ((item_mode & 1U) != 0) {
      item_mode = item_mode + L'\xffffffff';
    }
  }
  else {
    bVar3 = true;
  }
  q1 = L'\0';
  q2 = (uint)z_info->quiver_size + L'\xffffffff';
  if (bVar14) {
    q2 = L'\xffffffff';
  }
  while( true ) {
    local_79 = 0;
    if (q1 <= q2) {
      _Var6 = object_test(tester,player->upkeep->quiver[q1]);
      local_79 = _Var6 ^ 0xff;
    }
    if ((local_79 & 1) == 0) break;
    q1 = q1 + L'\x01';
  }
  while( true ) {
    local_7a = 0;
    if (q1 <= q2) {
      _Var6 = object_test(tester,player->upkeep->quiver[q2]);
      local_7a = _Var6 ^ 0xff;
    }
    if ((local_7a & 1) == 0) break;
    q2 = q2 + L'\xffffffff';
  }
  if ((q2 < q1) && ((allow_all & 1U) == 0)) {
    if ((item_mode & 8U) != 0) {
      item_mode = item_mode + L'\xfffffff8';
    }
  }
  else {
    bVar4 = true;
  }
  wVar9 = scan_floor(floor_list,(uint)uVar1,player,OFLOOR_VISIBLE|OFLOOR_SENSE|OFLOOR_TEST,tester);
  f1 = L'\0';
  f2 = wVar9 + L'\xffffffff';
  if (bVar15) {
    f2 = L'\xffffffff';
  }
  while( true ) {
    local_7b = 0;
    if (f1 <= f2) {
      _Var6 = object_test(tester,floor_list[f1]);
      local_7b = _Var6 ^ 0xff;
    }
    if ((local_7b & 1) == 0) break;
    f1 = f1 + L'\x01';
  }
  while( true ) {
    local_7c = 0;
    if (f1 <= f2) {
      _Var6 = object_test(tester,floor_list[f2]);
      local_7c = _Var6 ^ 0xff;
    }
    if ((local_7c & 1) == 0) break;
    f2 = f2 + L'\xffffffff';
  }
  if ((f2 < f1) && ((allow_all & 1U) == 0)) {
    if ((item_mode & 4U) != 0) {
      item_mode = item_mode + L'\xfffffffc';
    }
  }
  else {
    bVar5 = true;
  }
  throwing_num = scan_items(throwing_list,(long)iVar8,player,L'\x0e',obj_is_throwing);
  if ((((bVar2) || (bVar3)) || (bVar4)) || (bVar5)) {
    if (((mode & 0x800U) == 0) || (throwing_num == L'\0')) {
      if ((player->upkeep->command_wrk == L'\x01') && (bVar3)) {
        player->upkeep->command_wrk = L'\x01';
      }
      else if ((player->upkeep->command_wrk == L'\x02') && (bVar2)) {
        player->upkeep->command_wrk = L'\x02';
      }
      else if ((player->upkeep->command_wrk == L'\b') && (bVar4)) {
        player->upkeep->command_wrk = L'\b';
      }
      else if ((player->upkeep->command_wrk == L'\x04') && (bVar5)) {
        player->upkeep->command_wrk = L'\x04';
      }
      else if (((mode & 0x200U) == 0) || ((!bVar4 || (cmd == CMD_USE)))) {
        if ((bVar12) || (!bVar2)) {
          if ((bVar13) || (!bVar3)) {
            if ((bVar14) || (!bVar4)) {
              if ((bVar15) || (!bVar5)) {
                player->upkeep->command_wrk = L'\x02';
              }
              else {
                player->upkeep->command_wrk = L'\x04';
              }
            }
            else {
              player->upkeep->command_wrk = L'\b';
            }
          }
          else {
            player->upkeep->command_wrk = L'\x01';
          }
        }
        else {
          player->upkeep->command_wrk = L'\x02';
        }
      }
      else {
        player->upkeep->command_wrk = L'\b';
      }
    }
    else {
      player->upkeep->command_wrk = L'ࠀ';
    }
    do {
      local_54 = 0;
      local_58 = 0;
      for (ne = L'\0'; ne < L'\b'; ne = ne + L'\x01') {
        if (angband_term[ne] != (term *)0x0) {
          if ((window_flag[ne] & 1) != 0) {
            local_54 = local_54 + 1;
          }
          if ((window_flag[ne] & 2) != 0) {
            local_58 = local_58 + 1;
          }
        }
      }
      if (((local_54 != 0) && (local_58 == 0)) || ((local_54 == 0 && (local_58 != 0)))) {
        if (player->upkeep->command_wrk == L'\x01') {
          if (((local_58 != 0) && (!bVar7)) || ((local_54 != 0 && (bVar7)))) {
            toggle_inven_equip();
            bVar7 = (bool)(bVar7 ^ 1);
          }
        }
        else if (player->upkeep->command_wrk == L'\x02') {
          if (((local_54 != 0) && (!bVar7)) || ((local_58 != 0 && (bVar7)))) {
            toggle_inven_equip();
            bVar7 = (bool)(bVar7 ^ 1);
          }
        }
        else if (bVar7) {
          toggle_inven_equip();
          bVar7 = (bool)(bVar7 ^ 1);
        }
      }
      player->upkeep->redraw = player->upkeep->redraw | 0x60000;
      redraw_stuff(player);
      screen_save();
      wipe_obj_list();
      if (player->upkeep->command_wrk == L'\x02') {
        build_obj_list(i2,player->upkeep->inven,tester_m,olist_mode);
      }
      else if (player->upkeep->command_wrk == L'\x01') {
        build_obj_list(e2,(object **)0x0,tester_m,olist_mode);
      }
      else if (player->upkeep->command_wrk == L'\b') {
        build_obj_list(q2,player->upkeep->quiver,tester_m,olist_mode);
      }
      else if (player->upkeep->command_wrk == L'\x04') {
        build_obj_list(f2,floor_list,tester_m,olist_mode);
      }
      else if (player->upkeep->command_wrk == L'ࠀ') {
        build_obj_list(throwing_num,throwing_list,tester_m,olist_mode);
      }
      menu_header();
      if (pmt != (char *)0x0) {
        prt(pmt,L'\0',L'\0');
        sVar11 = strlen(pmt);
        prt(header,L'\0',(int)sVar11 + L'\x01');
      }
      newmenu = false;
      if (pmt == (char *)0x0) {
        local_88 = 0;
      }
      else {
        local_88 = strlen(pmt);
      }
      if (local_88 < 0xf) {
        local_90 = L'\x0f';
      }
      else {
        if (pmt == (char *)0x0) {
          local_98 = L'\0';
        }
        else {
          sVar11 = strlen(pmt);
          local_98 = (wchar_t)sVar11;
        }
        local_90 = local_98;
      }
      poVar10 = item_menu(cmd,local_90,mode);
      *choice = poVar10;
      screen_load();
      player->upkeep->redraw = player->upkeep->redraw | 0x60000;
      redraw_stuff(player);
      prt("",L'\0',L'\0');
    } while ((*choice == (object *)0x0) && ((newmenu & 1U) != 0));
    if (bVar7) {
      toggle_inven_equip();
    }
  }
  else {
    if (str != (char *)0x0) {
      msg("%s",str);
    }
    *choice = (object *)0x0;
  }
  player->upkeep->command_wrk = L'\0';
  mem_free(throwing_list);
  mem_free(floor_list);
  return *choice != (object *)0x0;
}

Assistant:

bool textui_get_item(struct object **choice, const char *pmt, const char *str,
					 cmd_code cmd, item_tester tester, int mode)
{
	bool use_inven = ((mode & USE_INVEN) ? true : false);
	bool use_equip = ((mode & USE_EQUIP) ? true : false);
	bool use_quiver = ((mode & USE_QUIVER) ? true : false);
	bool use_floor = ((mode & USE_FLOOR) ? true : false);
	bool quiver_tags = ((mode & QUIVER_TAGS) ? true : false);
	bool show_throwing = ((mode & SHOW_THROWING) ? true : false);

	bool allow_inven = false;
	bool allow_equip = false;
	bool allow_quiver = false;
	bool allow_floor = false;

	bool toggle = false;

	int floor_max = z_info->floor_size;
	int floor_num;

	int throwing_max = z_info->pack_size + z_info->quiver_size +
		z_info->floor_size;

	floor_list = mem_zalloc(floor_max * sizeof(*floor_list));
	throwing_list = mem_zalloc(throwing_max * sizeof(*throwing_list));
	olist_mode = 0;
	item_mode = mode;
	item_cmd = cmd;
	tester_m = tester;
	prompt = pmt;
	allow_all = str ? false : true;

	/* Object list display modes */
	if (mode & SHOW_FAIL)
		olist_mode |= OLIST_FAIL;
	else
		olist_mode |= OLIST_WEIGHT;

	if (mode & SHOW_PRICES)
		olist_mode |= OLIST_PRICE;

	if (mode & SHOW_EMPTY)
		olist_mode |= OLIST_SEMPTY;

	if (mode & SHOW_QUIVER)
		olist_mode |= OLIST_QUIVER;

	if (mode & SHOW_RECHARGE)
		olist_mode |= OLIST_RECHARGE;

	/* Paranoia XXX XXX XXX */
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Full inventory */
	i1 = 0;
	i2 = z_info->pack_size - 1;

	/* Forbid inventory */
	if (!use_inven) i2 = -1;

	/* Restrict inventory indexes */
	while ((i1 <= i2) && (!object_test(tester, player->upkeep->inven[i1])))
		i1++;
	while ((i1 <= i2) && (!object_test(tester, player->upkeep->inven[i2])))
		i2--;

	/* Accept inventory */
	if ((i1 <= i2) || allow_all)
		allow_inven = true;
	else if (item_mode & USE_INVEN)
		item_mode -= USE_INVEN;

	/* Full equipment */
	e1 = 0;
	e2 = player->body.count - 1;

	/* Forbid equipment */
	if (!use_equip) e2 = -1;

	/* Restrict equipment indexes unless starting with no command */
	if ((cmd != CMD_NULL) || (tester != NULL)) {
		while ((e1 <= e2) && (!object_test(tester, slot_object(player, e1))))
			e1++;
		while ((e1 <= e2) && (!object_test(tester, slot_object(player, e2))))
			e2--;
	}

	/* Accept equipment */
	if ((e1 <= e2) || allow_all)
		allow_equip = true;
	else if (item_mode & USE_EQUIP)
		item_mode -= USE_EQUIP;

	/* Restrict quiver indexes */
	q1 = 0;
	q2 = z_info->quiver_size - 1;

	/* Forbid quiver */
	if (!use_quiver) q2 = -1;

	/* Restrict quiver indexes */
	while ((q1 <= q2) && (!object_test(tester, player->upkeep->quiver[q1])))
		q1++;
	while ((q1 <= q2) && (!object_test(tester, player->upkeep->quiver[q2])))
		q2--;

	/* Accept quiver */
	if ((q1 <= q2) || allow_all)
		allow_quiver = true;
	else if (item_mode & USE_QUIVER)
		item_mode -= USE_QUIVER;

	/* Scan all non-gold objects in the grid */
	floor_num = scan_floor(floor_list, floor_max, player,
		OFLOOR_TEST | OFLOOR_SENSE | OFLOOR_VISIBLE, tester);

	/* Full floor */
	f1 = 0;
	f2 = floor_num - 1;

	/* Forbid floor */
	if (!use_floor) f2 = -1;

	/* Restrict floor indexes */
	while ((f1 <= f2) && (!object_test(tester, floor_list[f1]))) f1++;
	while ((f1 <= f2) && (!object_test(tester, floor_list[f2]))) f2--;

	/* Accept floor */
	if ((f1 <= f2) || allow_all)
		allow_floor = true;
	else if (item_mode & USE_FLOOR)
		item_mode -= USE_FLOOR;

	/* Scan all throwing objects in reach */
	throwing_num = scan_items(throwing_list, throwing_max, player,
		USE_INVEN | USE_QUIVER | USE_FLOOR, obj_is_throwing);

	/* Require at least one legal choice */
	if (allow_inven || allow_equip || allow_quiver || allow_floor) {
		/* Use throwing menu if at all possible */
		if (show_throwing && throwing_num) {
			player->upkeep->command_wrk = SHOW_THROWING;

			/* Start where requested if possible */
		} else if ((player->upkeep->command_wrk == USE_EQUIP) && allow_equip)
			player->upkeep->command_wrk = USE_EQUIP;
		else if ((player->upkeep->command_wrk == USE_INVEN) && allow_inven)
			player->upkeep->command_wrk = USE_INVEN;
		else if ((player->upkeep->command_wrk == USE_QUIVER) && allow_quiver)
			player->upkeep->command_wrk = USE_QUIVER;
		else if ((player->upkeep->command_wrk == USE_FLOOR) && allow_floor)
			player->upkeep->command_wrk = USE_FLOOR;

		/* If we are obviously using the quiver then start on quiver */
		else if (quiver_tags && allow_quiver && (cmd != CMD_USE))
			player->upkeep->command_wrk = USE_QUIVER;

		/* Otherwise choose whatever is allowed */
		else if (use_inven && allow_inven)
			player->upkeep->command_wrk = USE_INVEN;
		else if (use_equip && allow_equip)
			player->upkeep->command_wrk = USE_EQUIP;
		else if (use_quiver && allow_quiver)
			player->upkeep->command_wrk = USE_QUIVER;
		else if (use_floor && allow_floor)
			player->upkeep->command_wrk = USE_FLOOR;

		/* If nothing to choose, use (empty) inventory */
		else
			player->upkeep->command_wrk = USE_INVEN;

		while (true) {
			int j;
			int ni = 0;
			int ne = 0;

			/* If inven or equip is on the main screen, and only one of them
			 * is slated for a subwindow, we should show the opposite there */
			for (j = 0; j < ANGBAND_TERM_MAX; j++) {
				/* Unused */
				if (!angband_term[j]) continue;

				/* Count windows displaying inven */
				if (window_flag[j] & (PW_INVEN)) ni++;

				/* Count windows displaying equip */
				if (window_flag[j] & (PW_EQUIP)) ne++;
			}

			/* Are we in the situation where toggling makes sense? */
			if ((ni && !ne) || (!ni && ne)) {
				if (player->upkeep->command_wrk == USE_EQUIP) {
					if ((ne && !toggle) || (ni && toggle)) {
						/* Main screen is equipment, so is subwindow */
						toggle_inven_equip();
						toggle = !toggle;
					}
				} else if (player->upkeep->command_wrk == USE_INVEN) {
					if ((ni && !toggle) || (ne && toggle)) {
						/* Main screen is inventory, so is subwindow */
						toggle_inven_equip();
						toggle = !toggle;
					}
				} else {
					/* Quiver or floor, go back to the original */
					if (toggle) {
						toggle_inven_equip();
						toggle = !toggle;
					}
				}
			}

			/* Redraw */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

			/* Redraw windows */
			redraw_stuff(player);

			/* Save screen */
			screen_save();

			/* Build object list */
			wipe_obj_list();
			if (player->upkeep->command_wrk == USE_INVEN)
				build_obj_list(i2, player->upkeep->inven, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == USE_EQUIP)
				build_obj_list(e2, NULL, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == USE_QUIVER)
				build_obj_list(q2, player->upkeep->quiver, tester_m,olist_mode);
			else if (player->upkeep->command_wrk == USE_FLOOR)
				build_obj_list(f2, floor_list, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == SHOW_THROWING)
				build_obj_list(throwing_num, throwing_list, tester_m,
							   olist_mode);

			/* Show the prompt */
			menu_header();
			if (pmt) {
				prt(pmt, 0, 0);
				prt(header, 0, strlen(pmt) + 1);
			}

			/* No menu change request */
			newmenu = false;

			/* Get an item choice */
			*choice = item_menu(cmd, MAX(pmt ? strlen(pmt) : 0, 15), mode);

			/* Fix the screen */
			screen_load();

			/* Update */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
			redraw_stuff(player);

			/* Clear the prompt line */
			prt("", 0, 0);

			/* We have a selection, or are backing out */
			if (*choice || !newmenu) {
				if (toggle) toggle_inven_equip();
				break;
			}
		}
	} else {
		/* Warning if needed */
		if (str) msg("%s", str);
		*choice = NULL;
	}

	/* Clean up */
	player->upkeep->command_wrk = 0;
	mem_free(throwing_list);
	mem_free(floor_list);

	/* Result */
	return (*choice != NULL) ? true : false;
}